

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.cc
# Opt level: O0

void __thiscall
proto2_unittest::TestOneofBackwardsCompatible_FooGroup::Clear
          (TestOneofBackwardsCompatible_FooGroup *this)

{
  uint32_t *puVar1;
  uint32_t cached_has_bits;
  TestOneofBackwardsCompatible_FooGroup *this_local;
  
  puVar1 = google::protobuf::internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  if ((*puVar1 & 1) != 0) {
    google::protobuf::internal::ArenaStringPtr::ClearNonDefaultToEmpty(&(this->field_0)._impl_.b_);
  }
  (this->field_0)._impl_.a_ = 0;
  google::protobuf::internal::HasBits<1>::Clear(&(this->field_0)._impl_._has_bits_);
  google::protobuf::internal::InternalMetadata::Clear<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void TestOneofBackwardsCompatible_FooGroup::Clear() {
// @@protoc_insertion_point(message_clear_start:proto2_unittest.TestOneofBackwardsCompatible.FooGroup)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  cached_has_bits = _impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000001u) != 0) {
    _impl_.b_.ClearNonDefaultToEmpty();
  }
  _impl_.a_ = 0;
  _impl_._has_bits_.Clear();
  _internal_metadata_.Clear<::google::protobuf::UnknownFieldSet>();
}